

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O1

Tcl_HashEntry * ArrayCreate(Tcl_HashTable *tablePtr,char *key,int *newPtr)

{
  Tcl_HashEntry **ppTVar1;
  Tcl_HashEntry *pTVar2;
  int iVar3;
  Tcl_HashEntry *pTVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  Tcl_HashEntry *pTVar9;
  
  iVar3 = tablePtr->keyType;
  lVar7 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3 + 1;
    piVar8 = (int *)key;
    do {
      lVar7 = (long)(int)lVar7 + (long)*piVar8;
      piVar8 = piVar8 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
    lVar7 = lVar7 * 0x41c64e6d;
  }
  uVar6 = (uint)(lVar7 >> ((byte)tablePtr->downShift & 0x3f)) & tablePtr->mask;
  pTVar4 = tablePtr->buckets[(int)uVar6];
  pTVar2 = pTVar4;
  while( true ) {
    if (pTVar2 == (Tcl_HashEntry *)0x0) {
      ppTVar1 = tablePtr->buckets + (int)uVar6;
      *newPtr = 1;
      iVar3 = tablePtr->keyType;
      pTVar4 = (Tcl_HashEntry *)malloc((ulong)(iVar3 * 4 + 0x24));
      pTVar4->tablePtr = tablePtr;
      pTVar4->bucketPtr = ppTVar1;
      pTVar4->nextPtr = *ppTVar1;
      pTVar4->clientData = (ClientData)0x0;
      if (0 < (long)iVar3) {
        memcpy(&pTVar4->key,key,(long)iVar3 << 2);
      }
      *ppTVar1 = pTVar4;
      iVar3 = tablePtr->numEntries + 1;
      tablePtr->numEntries = iVar3;
      if (tablePtr->rebuildSize <= iVar3) {
        RebuildTable(tablePtr);
      }
      return pTVar4;
    }
    pTVar9 = pTVar4;
    if (iVar3 == 0) break;
    lVar7 = 0;
    while (*(int *)(key + lVar7 * 4) == *(int *)((long)&pTVar2->key + lVar7 * 4)) {
      lVar7 = lVar7 + 1;
      pTVar9 = pTVar2;
      if (iVar3 == (int)lVar7) goto LAB_00106f14;
    }
    pTVar2 = pTVar2->nextPtr;
  }
LAB_00106f14:
  *newPtr = 0;
  return pTVar9;
}

Assistant:

static Tcl_HashEntry *
ArrayCreate(Tcl_HashTable *tablePtr, register char *key, int *newPtr)
{
    register Tcl_HashEntry *hPtr;
    int *arrayPtr = (int *) key;
    register int *iPtr1, *iPtr2;
    int index, count;

    for (index = 0, count = tablePtr->keyType, iPtr1 = arrayPtr;
	 count > 0; count--, iPtr1++) {
	index += *iPtr1;
    }
    index = RANDOM_INDEX(tablePtr, index);

    /* 
     * Search all of the entries in the appropriate bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words,
	     count = tablePtr->keyType;; count--, iPtr1++, iPtr2++) {
	    if (count == 0) {
		*newPtr = 0;
		return hPtr;
	    }
	    if (*iPtr1 != *iPtr2) {
		break;
	    }
	}
    }

    /* 
     * Entry not found.  Add a new one to the bucket.
     */

    *newPtr = 1;
    hPtr = (Tcl_HashEntry *) malloc((unsigned) (sizeof(Tcl_HashEntry)
			       + (tablePtr->keyType * sizeof(int)) - 4));
    hPtr->tablePtr = tablePtr;
    hPtr->bucketPtr = &(tablePtr->buckets[index]);
    hPtr->nextPtr = *hPtr->bucketPtr;
    hPtr->clientData = 0;
    for (iPtr1 = arrayPtr, iPtr2 = hPtr->key.words, count = tablePtr->keyType;
	 count > 0; count--, iPtr1++, iPtr2++) {
	*iPtr2 = *iPtr1;
    }
    *hPtr->bucketPtr = hPtr;
    tablePtr->numEntries++;

    /* 
     * If the table has exceeded a decent size, rebuild it with many
     * more buckets.
     */

    if (tablePtr->numEntries >= tablePtr->rebuildSize) {
	RebuildTable(tablePtr);
    }
    return hPtr;
}